

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void Shutdown(NodeContext *node)

{
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *this;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  CTxMemPool *this_01;
  pointer puVar3;
  PeerManager *pPVar4;
  ValidationSignals *pVVar5;
  CConnman *this_02;
  CScheduler *this_03;
  NetGroupManager *__ptr_00;
  _Head_base<0UL,_CTxMemPool_*,_false> _Var6;
  CBlockPolicyEstimator *pCVar7;
  CoinsViews *pCVar8;
  pointer ppBVar9;
  Chainstate *this_04;
  _Head_base<0UL,_CoinsViews_*,_false> __ptr_01;
  ChainClient *pCVar10;
  _Head_base<0UL,_kernel::Context_*,_false> _Var11;
  FopenFn mockable_fopen_function;
  size_type sVar12;
  bool bVar13;
  char cVar14;
  unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_> *client;
  pointer ppBVar15;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *this_05;
  pointer puVar16;
  pointer *__ptr;
  _Alloc_hider _Var17;
  pointer puVar18;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  ArgsManager **val;
  code *pcVar19;
  error_code error;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock_shutdown;
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  undefined1 local_70 [16];
  path pid_path;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (Shutdown(node::NodeContext&)::g_shutdown_mutex == '\0') {
    Shutdown();
  }
  lock_shutdown.super_unique_lock._M_device = &Shutdown::g_shutdown_mutex.super_mutex;
  lock_shutdown.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::try_lock(&lock_shutdown.super_unique_lock);
  if (lock_shutdown.super_unique_lock._M_owns != false) {
    logging_function._M_str = "Shutdown";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp";
    source_file._M_len = 0x58;
    LogPrintFormatInternal<char[9]>
              (logging_function,source_file,0x113,ALL,Info,(ConstevalFormatString<1U>)0x7c9f9e,
               (char (*) [9])0x7f0cc9);
    val = &node->args;
    inline_assertion_check<true,ArgsManager*&>
              (val,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
               ,0x114,"Shutdown","node.args");
    paVar1 = &pid_path.super_path._M_pathname.field_2;
    pid_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pid_path,"shutoff","");
    util::ThreadRename((string *)&pid_path);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pid_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                      pid_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
    }
    this_01 = (node->mempool)._M_t.
              super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
              super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
              super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (this_01 != (CTxMemPool *)0x0) {
      CTxMemPool::AddTransactionsUpdated(this_01,1);
    }
    StopHTTPRPC();
    StopREST();
    pid_path.super_path._M_pathname._M_dataplus._M_p =
         (pointer)std::any::_Manager_internal<node::NodeContext_*>::_S_manage;
    pid_path.super_path._M_pathname._M_string_length = (size_type)node;
    StopRPC((any *)&pid_path);
    if (pid_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
      (*(code *)pid_path.super_path._M_pathname._M_dataplus._M_p)(3,&pid_path,0);
    }
    StopHTTPServer();
    puVar3 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (node->chain_clients).
                   super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
        puVar16 = puVar16 + 1) {
      (*((puVar16->_M_t).
         super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
         ._M_t.
         super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
         .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
        [6])();
    }
    StopMapPort();
    pPVar4 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    if ((pPVar4 != (PeerManager *)0x0) &&
       (pVVar5 = (node->validation_signals)._M_t.
                 super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                 .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
       pVVar5 != (ValidationSignals *)0x0)) {
      ValidationSignals::UnregisterValidationInterface(pVVar5,&pPVar4->super_CValidationInterface);
    }
    this_02 = (node->connman)._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>.
              _M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
              super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
    if (this_02 != (CConnman *)0x0) {
      CConnman::StopThreads(this_02);
      CConnman::StopNodes(this_02);
    }
    StopTorControl();
    if ((node->background_init_thread)._M_id._M_thread != 0) {
      std::thread::join();
    }
    this_03 = (node->scheduler)._M_t.
              super___uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>._M_t.
              super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
              super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl;
    if (this_03 != (CScheduler *)0x0) {
      CScheduler::stop(this_03);
    }
    pPVar4 = (node->peerman)._M_t.
             super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
             super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
             super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
    (node->peerman)._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
    super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl = (PeerManager *)0x0;
    if (pPVar4 != (PeerManager *)0x0) {
      (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    this = &node->mempool;
    std::__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>::reset
              ((__uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> *)&node->connman,
               (pointer)0x0);
    std::__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>::reset
              ((__uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_> *)&node->banman,(pointer)0x0);
    std::__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>::reset
              ((__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&node->addrman,
               (pointer)0x0);
    __ptr_00 = (node->netgroupman)._M_t.
               super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
               .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
    (node->netgroupman)._M_t.
    super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl = (NetGroupManager *)0x0;
    if (__ptr_00 != (NetGroupManager *)0x0) {
      std::default_delete<const_NetGroupManager>::operator()
                ((default_delete<const_NetGroupManager> *)&node->netgroupman,__ptr_00);
    }
    _Var6._M_head_impl =
         (this->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
         super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
         super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    if (((_Var6._M_head_impl != (CTxMemPool *)0x0) &&
        (bVar13 = CTxMemPool::GetLoadTried(_Var6._M_head_impl), bVar13)) &&
       (bVar13 = ::node::ShouldPersistMempool(*val), bVar13)) {
      _Var6._M_head_impl =
           (this->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
      ::node::MempoolPath(&pid_path,*val);
      pcVar19 = std::
                _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
                ::_M_manager;
      mockable_fopen_function.super__Function_base._M_functor._8_8_ = fsbridge::fopen;
      mockable_fopen_function.super__Function_base._M_functor._M_unused._M_object = val;
      mockable_fopen_function.super__Function_base._M_manager = (_Manager_type)0x0;
      mockable_fopen_function._M_invoker =
           std::
           _Function_handler<_IO_FILE_*(const_fs::path_&,_const_char_*),__IO_FILE_*(*)(const_fs::path_&,_const_char_*)>
           ::_M_manager;
      ::node::DumpMempool(_Var6._M_head_impl,&pid_path,mockable_fopen_function,
                          SUB81(&stack0xffffffffffffff20,0));
      if (pcVar19 != (code *)0x0) {
        (*pcVar19)(&stack0xffffffffffffff20,&stack0xffffffffffffff20,3);
      }
      std::filesystem::__cxx11::path::~path(&pid_path.super_path);
    }
    pCVar7 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    if (pCVar7 != (CBlockPolicyEstimator *)0x0) {
      CBlockPolicyEstimator::Flush(pCVar7);
      pVVar5 = (node->validation_signals)._M_t.
               super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
               _M_t.
               super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
               super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
      if (pVVar5 != (ValidationSignals *)0x0) {
        ValidationSignals::UnregisterValidationInterface
                  (pVVar5,&((node->fee_estimator)._M_t.
                            super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
                            .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl)->
                           super_CValidationInterface);
      }
    }
    this_00 = &node->chainman;
    if ((node->chainman)._M_t.
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      criticalblock23.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock23.super_unique_lock._8_8_ =
           criticalblock23.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock23.super_unique_lock);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (this_00->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      sVar12 = pid_path.super_path._M_pathname._M_string_length;
      for (_Var17 = pid_path.super_path._M_pathname._M_dataplus; _Var17._M_p != (pointer)sVar12;
          _Var17._M_p = _Var17._M_p + 8) {
        pCVar8 = ((*(Chainstate **)_Var17._M_p)->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar8 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar8->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(*(Chainstate **)_Var17._M_p);
        }
      }
      if (pid_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                        pid_path.super_path._M_pathname.field_2._M_allocated_capacity -
                        (long)pid_path.super_path._M_pathname._M_dataplus._M_p);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
    }
    pVVar5 = (node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar5 != (ValidationSignals *)0x0) {
      ValidationSignals::FlushBackgroundCallbacks(pVVar5);
    }
    ppBVar9 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppBVar15 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppBVar15 != ppBVar9;
        ppBVar15 = ppBVar15 + 1) {
      BaseIndex::Stop(*ppBVar15);
    }
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      std::__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>::reset
                ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_> *)&g_txindex,(pointer)0x0)
      ;
    }
    if ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)
        g_coin_stats_index._M_t.
        super___uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>._M_t.
        super__Tuple_impl<0UL,_CoinStatsIndex_*,_std::default_delete<CoinStatsIndex>_>.
        super__Head_base<0UL,_CoinStatsIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>)0x0) {
      std::__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_>::reset
                ((__uniq_ptr_impl<CoinStatsIndex,_std::default_delete<CoinStatsIndex>_> *)
                 &g_coin_stats_index,(pointer)0x0);
    }
    DestroyAllBlockFilterIndexes();
    ppBVar15 = (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar15) {
      (node->indexes).super__Vector_base<BaseIndex_*,_std::allocator<BaseIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar15;
    }
    if ((this_00->_M_t).
        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
        super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl != (ChainstateManager *)0x0)
    {
      criticalblock23.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock23.super_unique_lock._8_8_ =
           criticalblock23.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock23.super_unique_lock);
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&pid_path,
                 (this_00->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      sVar12 = pid_path.super_path._M_pathname._M_string_length;
      for (_Var17 = pid_path.super_path._M_pathname._M_dataplus; _Var17._M_p != (pointer)sVar12;
          _Var17._M_p = _Var17._M_p + 8) {
        this_04 = *(Chainstate **)_Var17._M_p;
        pCVar8 = (this_04->m_coins_views)._M_t.
                 super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
                 super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
                 super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
        if ((pCVar8 != (CoinsViews *)0x0) &&
           ((_Head_base<0UL,_CCoinsViewCache_*,_false>)
            *(_Tuple_impl<0UL,_CCoinsViewCache_*,_std::default_delete<CCoinsViewCache>_> *)
             &(pCVar8->m_cacheview)._M_t.
              super___uniq_ptr_impl<CCoinsViewCache,_std::default_delete<CCoinsViewCache>_> !=
            (CCoinsViewCache *)0x0)) {
          Chainstate::ForceFlushStateToDisk(this_04);
          this_05 = &this_04->m_coins_views;
          __ptr_01._M_head_impl =
               (this_05->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
               _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
               super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
          (this_05->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
          super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
          super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl = (CoinsViews *)0x0;
          if (__ptr_01._M_head_impl != (CoinsViews *)0x0) {
            std::default_delete<CoinsViews>::operator()
                      ((default_delete<CoinsViews> *)this_05,__ptr_01._M_head_impl);
          }
        }
      }
      if (pid_path.super_path._M_pathname._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(pid_path.super_path._M_pathname._M_dataplus._M_p,
                        pid_path.super_path._M_pathname.field_2._M_allocated_capacity -
                        (long)pid_path.super_path._M_pathname._M_dataplus._M_p);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
    }
    puVar16 = (node->chain_clients).
              super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (node->chain_clients).
             super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar3) {
      do {
        (*((puVar16->_M_t).
           super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
           ._M_t.
           super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
           .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl)->_vptr_ChainClient
          [7])();
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar3);
      puVar16 = (node->chain_clients).
                super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (node->chain_clients).
               super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar18 = puVar16;
      if (puVar3 != puVar16) {
        do {
          pCVar10 = (puVar18->_M_t).
                    super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
                    .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl;
          if (pCVar10 != (ChainClient *)0x0) {
            (*pCVar10->_vptr_ChainClient[1])();
          }
          (puVar18->_M_t).
          super___uniq_ptr_impl<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>
          ._M_t.
          super__Tuple_impl<0UL,_interfaces::ChainClient_*,_std::default_delete<interfaces::ChainClient>_>
          .super__Head_base<0UL,_interfaces::ChainClient_*,_false>._M_head_impl = (ChainClient *)0x0
          ;
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar3);
        (node->chain_clients).
        super__Vector_base<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>,_std::allocator<std::unique_ptr<interfaces::ChainClient,_std::default_delete<interfaces::ChainClient>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar16;
      }
    }
    pVVar5 = (node->validation_signals)._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (pVVar5 != (ValidationSignals *)0x0) {
      ValidationSignals::UnregisterAllValidationInterfaces(pVVar5);
    }
    _Var6._M_head_impl =
         (this->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
         super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
         super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    (this->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl = (CTxMemPool *)0x0;
    if (_Var6._M_head_impl != (CTxMemPool *)0x0) {
      std::default_delete<CTxMemPool>::operator()
                ((default_delete<CTxMemPool> *)this,_Var6._M_head_impl);
    }
    pCVar7 = (node->fee_estimator)._M_t.
             super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>
             ._M_t.
             super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>
             .super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl;
    (node->fee_estimator)._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (CBlockPolicyEstimator *)0x0;
    if (pCVar7 != (CBlockPolicyEstimator *)0x0) {
      (*(pCVar7->super_CValidationInterface)._vptr_CValidationInterface[0xb])();
    }
    std::__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>::reset
              ((__uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               this_00,(pointer)0x0);
    std::__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               &node->validation_signals,(pointer)0x0);
    std::__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> *)&node->scheduler,
               (pointer)0x0);
    std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
              ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)&node->ecc_context
               ,(pointer)0x0);
    _Var11._M_head_impl =
         (node->kernel)._M_t.
         super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
         super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
         super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
    (node->kernel)._M_t.
    super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
    super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
    super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = (Context *)0x0;
    if (_Var11._M_head_impl != (Context *)0x0) {
      operator_delete(_Var11._M_head_impl,1);
    }
    if (g_generated_pid == '\x01') {
      GetPidFile(&pid_path,*val);
      error._M_value = 0;
      error._M_cat = (error_category *)std::_V2::system_category();
      cVar14 = std::filesystem::remove(&pid_path.super_path,&error);
      if (cVar14 == '\0') {
        if (error._M_value == 0) {
          criticalblock23.super_unique_lock._M_device = (mutex_type *)local_70;
          __dnew = 0x13;
          criticalblock23.super_unique_lock._M_device =
               (mutex_type *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &criticalblock23,&__dnew,0);
          local_70._0_8_ = __dnew;
          ((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__lock = 0x656c6946;
          ((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__count = 0x656f6420;
          ((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__owner = 0x6f6e2073;
          ((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __data.__nusers = 0x78652074;
          *(undefined4 *)
           ((long)&((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base).
                   _M_mutex.__data.__nusers + 3) = 0x74736978;
          criticalblock23.super_unique_lock._8_8_ = __dnew;
          ((criticalblock23.super_unique_lock._M_device)->super___recursive_mutex_base)._M_mutex.
          __size[__dnew] = '\0';
        }
        else {
          (**(code **)(*(long *)error._M_cat + 0x20))(&criticalblock23);
        }
        __dnew = (size_type)&local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__dnew,pid_path.super_path._M_pathname._M_dataplus._M_p,
                   pid_path.super_path._M_pathname._M_dataplus._M_p +
                   pid_path.super_path._M_pathname._M_string_length);
        logging_function_00._M_str = "RemovePidFile";
        logging_function_00._M_len = 0xd;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
        ;
        source_file_00._M_len = 0x58;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xc4,ALL,Info,
                   (ConstevalFormatString<2U>)0x7cffc1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__dnew,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock23);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_90) {
          operator_delete((void *)__dnew,local_90._M_allocated_capacity + 1);
        }
        if (criticalblock23.super_unique_lock._M_device != (mutex_type *)local_70) {
          operator_delete(criticalblock23.super_unique_lock._M_device,local_70._0_8_ + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&pid_path.super_path);
    }
    logging_function_01._M_str = "Shutdown";
    logging_function_01._M_len = 8;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp";
    source_file_01._M_len = 0x58;
    LogPrintFormatInternal<char[9]>
              (logging_function_01,source_file_01,0x185,ALL,Info,(ConstevalFormatString<1U>)0x7c9fba
               ,(char (*) [9])0x7f0cc9);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock_shutdown.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Shutdown(NodeContext& node)
{
    static Mutex g_shutdown_mutex;
    TRY_LOCK(g_shutdown_mutex, lock_shutdown);
    if (!lock_shutdown) return;
    LogPrintf("%s: In progress...\n", __func__);
    Assert(node.args);

    /// Note: Shutdown() must be able to handle cases in which initialization failed part of the way,
    /// for example if the data directory was found to be locked.
    /// Be sure that anything that writes files or flushes caches only does this if the respective
    /// module was initialized.
    util::ThreadRename("shutoff");
    if (node.mempool) node.mempool->AddTransactionsUpdated(1);

    StopHTTPRPC();
    StopREST();
    StopRPC(&node);
    StopHTTPServer();
    for (const auto& client : node.chain_clients) {
        client->flush();
    }
    StopMapPort();

    // Because these depend on each-other, we make sure that neither can be
    // using the other before destroying them.
    if (node.peerman && node.validation_signals) node.validation_signals->UnregisterValidationInterface(node.peerman.get());
    if (node.connman) node.connman->Stop();

    StopTorControl();

    if (node.background_init_thread.joinable()) node.background_init_thread.join();
    // After everything has been shut down, but before things get flushed, stop the
    // the scheduler. After this point, SyncWithValidationInterfaceQueue() should not be called anymore
    // as this would prevent the shutdown from completing.
    if (node.scheduler) node.scheduler->stop();

    // After the threads that potentially access these pointers have been stopped,
    // destruct and reset all to nullptr.
    node.peerman.reset();
    node.connman.reset();
    node.banman.reset();
    node.addrman.reset();
    node.netgroupman.reset();

    if (node.mempool && node.mempool->GetLoadTried() && ShouldPersistMempool(*node.args)) {
        DumpMempool(*node.mempool, MempoolPath(*node.args));
    }

    // Drop transactions we were still watching, record fee estimations and unregister
    // fee estimator from validation interface.
    if (node.fee_estimator) {
        node.fee_estimator->Flush();
        if (node.validation_signals) {
            node.validation_signals->UnregisterValidationInterface(node.fee_estimator.get());
        }
    }

    // FlushStateToDisk generates a ChainStateFlushed callback, which we should avoid missing
    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
            }
        }
    }

    // After there are no more peers/RPC left to give us new data which may generate
    // CValidationInterface callbacks, flush them...
    if (node.validation_signals) node.validation_signals->FlushBackgroundCallbacks();

    // Stop and delete all indexes only after flushing background callbacks.
    for (auto* index : node.indexes) index->Stop();
    if (g_txindex) g_txindex.reset();
    if (g_coin_stats_index) g_coin_stats_index.reset();
    DestroyAllBlockFilterIndexes();
    node.indexes.clear(); // all instances are nullptr now

    // Any future callbacks will be dropped. This should absolutely be safe - if
    // missing a callback results in an unrecoverable situation, unclean shutdown
    // would too. The only reason to do the above flushes is to let the wallet catch
    // up with our current chain to avoid any strange pruning edge cases and make
    // next startup faster by avoiding rescan.

    if (node.chainman) {
        LOCK(cs_main);
        for (Chainstate* chainstate : node.chainman->GetAll()) {
            if (chainstate->CanFlushToDisk()) {
                chainstate->ForceFlushStateToDisk();
                chainstate->ResetCoinsViews();
            }
        }
    }
    for (const auto& client : node.chain_clients) {
        client->stop();
    }

#ifdef ENABLE_ZMQ
    if (g_zmq_notification_interface) {
        if (node.validation_signals) node.validation_signals->UnregisterValidationInterface(g_zmq_notification_interface.get());
        g_zmq_notification_interface.reset();
    }
#endif

    node.chain_clients.clear();
    if (node.validation_signals) {
        node.validation_signals->UnregisterAllValidationInterfaces();
    }
    node.mempool.reset();
    node.fee_estimator.reset();
    node.chainman.reset();
    node.validation_signals.reset();
    node.scheduler.reset();
    node.ecc_context.reset();
    node.kernel.reset();

    RemovePidFile(*node.args);

    LogPrintf("%s: done\n", __func__);
}